

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdReport.cpp
# Opt level: O0

string * getScriptName(string *__return_storage_ptr__,string *script_path)

{
  string local_38;
  string *local_18;
  string *script_path_local;
  
  local_18 = script_path;
  script_path_local = __return_storage_ptr__;
  basename((char *)&local_38);
  dropExtension(__return_storage_ptr__,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string getScriptName (const std::string& script_path)
{
  return dropExtension (basename (script_path));
}